

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void P_ClearACSVars(bool alsoglobal)

{
  int local_10;
  int i;
  bool alsoglobal_local;
  
  memset(ACS_WorldVars,0,0x400);
  for (local_10 = 0; local_10 < 0x100; local_10 = local_10 + 1) {
    TMap<int,_int,_THashTraits<int>,_InitIntToZero>::Clear(ACS_WorldArrays + local_10,1);
  }
  if (alsoglobal) {
    memset(ACS_GlobalVars,0,0x100);
    for (local_10 = 0; local_10 < 0x40; local_10 = local_10 + 1) {
      TMap<int,_int,_THashTraits<int>,_InitIntToZero>::Clear(ACS_GlobalArrays + local_10,1);
    }
    ACSStringPool::Clear(&GlobalACSStrings);
  }
  else {
    P_MarkGlobalVarStrings();
    ACSStringPool::PurgeStrings(&GlobalACSStrings);
  }
  return;
}

Assistant:

void P_ClearACSVars(bool alsoglobal)
{
	int i;

	memset (ACS_WorldVars, 0, sizeof(ACS_WorldVars));
	for (i = 0; i < NUM_WORLDVARS; ++i)
	{
		ACS_WorldArrays[i].Clear ();
	}
	if (alsoglobal)
	{
		memset (ACS_GlobalVars, 0, sizeof(ACS_GlobalVars));
		for (i = 0; i < NUM_GLOBALVARS; ++i)
		{
			ACS_GlobalArrays[i].Clear ();
		}
		// Since we cleared all ACS variables, we know nothing refers to them
		// anymore.
		GlobalACSStrings.Clear();
	}
	else
	{
		// Purge any strings that aren't referenced by global variables, since
		// they're the only possible references left.
		P_MarkGlobalVarStrings();
		GlobalACSStrings.PurgeStrings();
	}
}